

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Core.cpp
# Opt level: O0

bool __thiscall RenX::Core::initialize(Core *this)

{
  FILE *__stream;
  bool bVar1;
  unsigned_short uVar2;
  uint uVar3;
  pointer pSVar4;
  string *this_00;
  char *pcVar5;
  pointer pbVar6;
  sockaddr *__addr;
  int __fd;
  undefined1 auVar7 [16];
  basic_string_view<char,_std::char_traits<char>_> bVar8;
  unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_> local_d8;
  undefined4 local_d0;
  __single_object server;
  basic_string_view<char,_std::char_traits<char>_> *entry;
  iterator __end1;
  iterator __begin1;
  container_type *__range1;
  undefined1 local_88 [8];
  container_type server_entries;
  char *local_68;
  size_t local_60;
  char *local_58;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  undefined1 local_20 [8];
  string_view serverList;
  Core *this_local;
  
  serverList._M_str = (char *)this;
  (**(code **)(*(long *)banDatabase + 0x20))();
  (**(code **)(*(long *)exemptionDatabase + 0x20))();
  (*(code *)**(undefined8 **)tags)();
  initTranslations((Config *)&this->field_0x38);
  local_30 = sv("Servers",7);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40);
  auVar7 = Jupiter::Config::get
                     (&this->field_0x38,local_30._M_len,local_30._M_str,local_40._M_len,
                      local_40._M_str);
  serverList._M_len = auVar7._8_8_;
  local_20 = auVar7._0_8_;
  bVar8 = sv("CommandsFile",0xc);
  join_0x00000010_0x00000000_ = sv("RenXGameCommands.ini",0x14);
  local_60 = bVar8._M_len;
  local_58 = bVar8._M_str;
  pbVar6 = server_entries.
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  auVar7 = Jupiter::Config::get
                     (&this->field_0x38,local_60,local_58,
                      server_entries.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,local_68);
  Jupiter::Config::read(&this->m_commandsFile,auVar7._0_8_,auVar7._8_8_);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&__range1," \t");
  jessilib::
  word_split_view<std::vector,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
            ((container_type *)local_88,(basic_string_view<char,_std::char_traits<char>_> *)local_20
             ,(basic_string_view<char,_std::char_traits<char>_> *)&__range1);
  __end1 = std::
           vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::begin((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)local_88);
  entry = (basic_string_view<char,_std::char_traits<char>_> *)
          std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::end((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)local_88);
  while (bVar1 = __gnu_cxx::
                 operator==<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                           (&__end1,(__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                     *)&entry), ((bVar1 ^ 0xffU) & 1) != 0) {
    server._M_t.super___uniq_ptr_impl<RenX::Server,_std::default_delete<RenX::Server>_>._M_t.
    super__Tuple_impl<0UL,_RenX::Server_*,_std::default_delete<RenX::Server>_>.
    super__Head_base<0UL,_RenX::Server_*,_false>._M_head_impl =
         (__uniq_ptr_data<RenX::Server,_std::default_delete<RenX::Server>,_true,_true>)
         __gnu_cxx::
         __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
         ::operator*(&__end1);
    __fd = (int)server._M_t.super___uniq_ptr_impl<RenX::Server,_std::default_delete<RenX::Server>_>.
                _M_t.super__Tuple_impl<0UL,_RenX::Server_*,_std::default_delete<RenX::Server>_>.
                super__Head_base<0UL,_RenX::Server_*,_false>._M_head_impl;
    std::make_unique<RenX::Server,std::basic_string_view<char,std::char_traits<char>>const&>
              ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff40);
    pSVar4 = std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>::operator->
                       ((unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_> *)
                        &stack0xffffffffffffff40);
    uVar3 = Server::connect(pSVar4,__fd,__addr,(socklen_t)pbVar6);
    __stream = _stderr;
    if ((uVar3 & 1) == 0) {
      pSVar4 = std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>::operator->
                         ((unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_> *)
                          &stack0xffffffffffffff40);
      this_00 = Server::getHostname_abi_cxx11_(pSVar4);
      pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(this_00);
      pSVar4 = std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>::operator->
                         ((unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_> *)
                          &stack0xffffffffffffff40);
      uVar2 = Server::getPort(pSVar4);
      uVar3 = Jupiter::Socket::getLastError();
      pbVar6 = (pointer)(ulong)uVar2;
      fprintf(__stream,"[RenX] ERROR: Failed to connect to %s on port %u. Error code: %d\r\n",pcVar5
              ,pbVar6,(ulong)uVar3);
      local_d0 = 3;
    }
    else {
      std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>::unique_ptr
                (&local_d8,
                 (unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_> *)
                 &stack0xffffffffffffff40);
      addServer(this,&local_d8);
      std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>::~unique_ptr(&local_d8);
      local_d0 = 0;
    }
    std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>::~unique_ptr
              ((unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_> *)
               &stack0xffffffffffffff40);
    __gnu_cxx::
    __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::operator++(&__end1);
  }
  local_d0 = 1;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *)local_88);
  return true;
}

Assistant:

bool RenX::Core::initialize() {
	RenX::banDatabase->initialize();
	RenX::exemptionDatabase->initialize();
	RenX::tags->initialize();
	RenX::initTranslations(this->config);

	std::string_view serverList = this->config.get("Servers"sv);
	m_commandsFile.read(this->config.get("CommandsFile"sv, "RenXGameCommands.ini"sv));

	auto server_entries = jessilib::word_split_view(serverList, WHITESPACE_SV);
	for (const auto& entry : server_entries) {
		auto server = std::make_unique<RenX::Server>(entry);

		if (server->connect() == false) {
			fprintf(stderr, "[RenX] ERROR: Failed to connect to %s on port %u. Error code: %d" ENDL, server->getHostname().c_str(), server->getPort(), Jupiter::Socket::getLastError());
			continue;
		}

		addServer(std::move(server));
	}

	return true;
}